

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O3

int varinfo_set_mode(varinfo *info,char *mode)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  int data;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar2 = symtab_get_t(info->data->symtab,mode,3,&local_14);
  if (iVar2 == -1) {
    fprintf(_stderr,"no mode %s\n",mode);
  }
  else {
    iVar2 = info->data->modes[local_14].modeset;
    iVar1 = info->modes[iVar2];
    if (iVar1 == local_14 || iVar1 == -1) {
      info->modes[iVar2] = local_14;
      return 0;
    }
    varinfo_set_mode_cold_1();
  }
  return -1;
}

Assistant:

int varinfo_set_mode(struct varinfo *info, const char *mode) {
	int data;
	if (symtab_get_t(info->data->symtab, mode, VARDATA_ST_MODE, &data) == -1) {
		fprintf(stderr, "no mode %s\n", mode);
		return -1;
	}
	int modeset = info->data->modes[data].modeset;
	if (info->modes[modeset] != -1 && info->modes[modeset] != data) {
		fprintf(stderr, "a mode from modeset %s has already been selected\n", info->data->modesets[modeset].name);
		return -1;
	}
	info->modes[modeset] = data;
	/* XXX: validate mode */
	return 0;
}